

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O0

int main(int argc,char **argv)

{
  Uint32 UVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_a8;
  undefined8 local_80;
  SDL_PixelFormat format;
  SDL_Surface *newsurf;
  int i;
  Uint32 now;
  Uint32 then;
  char *bmpfile;
  Uint32 overlay_format;
  Uint32 video_flags;
  int desired_bpp;
  int delay;
  char *argv0;
  char **argv_local;
  int argc_local;
  
  pcVar6 = *argv;
  scale = 0;
  monochrome = 0;
  luminance = 100;
  video_flags = 1;
  w = 0x280;
  h = 0x1e0;
  overlay_format = 0;
  bmpfile._4_4_ = 0;
  bmpfile._0_4_ = 0x32315659;
  argv0 = (char *)argv;
  argv_local._0_4_ = argc;
  while (1 < (int)argv_local) {
    iVar3 = strcmp(*(char **)(argv0 + 8),"-delay");
    if (iVar3 == 0) {
      if (*(long *)(argv0 + 0x10) == 0) {
        fprintf(_stderr,"The -delay option requires an argument\n");
        return 1;
      }
      video_flags = atoi(*(char **)(argv0 + 0x10));
      argv0 = argv0 + 0x10;
      argv_local._0_4_ = (int)argv_local + -2;
    }
    else {
      iVar3 = strcmp(*(char **)(argv0 + 8),"-width");
      if (iVar3 == 0) {
        if ((*(long *)(argv0 + 0x10) == 0) || (w = atoi(*(char **)(argv0 + 0x10)), w < 1)) {
          fprintf(_stderr,"The -width option requires an argument\n");
          return 1;
        }
        argv0 = argv0 + 0x10;
        argv_local._0_4_ = (int)argv_local + -2;
      }
      else {
        iVar3 = strcmp(*(char **)(argv0 + 8),"-height");
        if (iVar3 == 0) {
          if ((*(long *)(argv0 + 0x10) == 0) || (h = atoi(*(char **)(argv0 + 0x10)), h < 1)) {
            fprintf(_stderr,"The -height option requires an argument\n");
            return 1;
          }
          argv0 = argv0 + 0x10;
          argv_local._0_4_ = (int)argv_local + -2;
        }
        else {
          iVar3 = strcmp(*(char **)(argv0 + 8),"-bpp");
          if (iVar3 == 0) {
            if (*(long *)(argv0 + 0x10) == 0) {
              fprintf(_stderr,"The -bpp option requires an argument\n");
              return 1;
            }
            overlay_format = atoi(*(char **)(argv0 + 0x10));
            argv0 = argv0 + 0x10;
            argv_local._0_4_ = (int)argv_local + -2;
          }
          else {
            iVar3 = strcmp(*(char **)(argv0 + 8),"-lum");
            if (iVar3 == 0) {
              if (*(long *)(argv0 + 0x10) == 0) {
                fprintf(_stderr,"The -lum option requires an argument\n");
                return 1;
              }
              luminance = atoi(*(char **)(argv0 + 0x10));
              argv0 = argv0 + 0x10;
              argv_local._0_4_ = (int)argv_local + -2;
            }
            else {
              iVar3 = strcmp(*(char **)(argv0 + 8),"-format");
              if (iVar3 == 0) {
                if (*(long *)(argv0 + 0x10) == 0) {
                  fprintf(_stderr,"The -format option requires an argument\n");
                  return 1;
                }
                iVar3 = strcmp(*(char **)(argv0 + 0x10),"YV12");
                if (iVar3 == 0) {
                  bmpfile._0_4_ = 0x32315659;
                }
                else {
                  iVar3 = strcmp(*(char **)(argv0 + 0x10),"IYUV");
                  if (iVar3 == 0) {
                    bmpfile._0_4_ = 0x56555949;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(argv0 + 0x10),"YUY2");
                    if (iVar3 == 0) {
                      bmpfile._0_4_ = 0x32595559;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(argv0 + 0x10),"UYVY");
                      if (iVar3 == 0) {
                        bmpfile._0_4_ = 0x59565955;
                      }
                      else {
                        iVar3 = strcmp(*(char **)(argv0 + 0x10),"YVYU");
                        if (iVar3 != 0) {
                          fprintf(_stderr,"The -format option %s is not recognized\n",
                                  *(undefined8 *)(argv0 + 0x10));
                          return 1;
                        }
                        bmpfile._0_4_ = 0x55595659;
                      }
                    }
                  }
                }
                argv0 = argv0 + 0x10;
                argv_local._0_4_ = (int)argv_local + -2;
              }
              else {
                iVar3 = strcmp(*(char **)(argv0 + 8),"-hw");
                if (iVar3 == 0) {
                  bmpfile._4_4_ = bmpfile._4_4_ | 1;
                }
                else {
                  iVar3 = strcmp(*(char **)(argv0 + 8),"-flip");
                  if (iVar3 == 0) {
                    bmpfile._4_4_ = bmpfile._4_4_ | 0x40000000;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(argv0 + 8),"-scale");
                    if (iVar3 == 0) {
                      scale = 1;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(argv0 + 8),"-mono");
                      if (iVar3 == 0) {
                        monochrome = 1;
                      }
                      else {
                        iVar3 = strcmp(*(char **)(argv0 + 8),"-help");
                        if ((iVar3 == 0) || (iVar3 = strcmp(*(char **)(argv0 + 8),"-h"), iVar3 == 0)
                           ) {
                          PrintUsage(pcVar6);
                          return 1;
                        }
                        iVar3 = strcmp(*(char **)(argv0 + 8),"-fullscreen");
                        if (iVar3 != 0) break;
                        bmpfile._4_4_ = bmpfile._4_4_ | 0x80000000;
                      }
                    }
                  }
                }
                argv_local._0_4_ = (int)argv_local + -1;
                argv0 = argv0 + 8;
              }
            }
          }
        }
      }
    }
  }
  iVar3 = SDL_Init(0x20);
  pFVar2 = _stderr;
  if (iVar3 < 0) {
    uVar5 = SDL_GetError();
    fprintf(pFVar2,"Couldn\'t initialize SDL: %s\n",uVar5);
    argv_local._4_4_ = 1;
  }
  else {
    screen = (SDL_Surface *)SDL_SetVideoMode(w,h,overlay_format,bmpfile._4_4_);
    pFVar2 = _stderr;
    iVar4 = w;
    iVar3 = h;
    if (screen == (SDL_Surface *)0x0) {
      uVar5 = SDL_GetError();
      fprintf(pFVar2,"Couldn\'t set %dx%dx%d video mode: %s\n",(ulong)(uint)iVar4,(ulong)(uint)iVar3
              ,(ulong)overlay_format,uVar5);
      quit(1);
    }
    pcVar6 = "";
    if ((screen->flags & 0x80000000) != 0) {
      pcVar6 = " fullscreen";
    }
    printf("Set%s %dx%dx%d mode\n",pcVar6,(ulong)(uint)screen->w,(ulong)(uint)screen->h,
           (ulong)screen->format->BitsPerPixel);
    pcVar6 = "system";
    if ((screen->flags & 1) != 0) {
      pcVar6 = "video";
    }
    printf("(video surface located in %s memory)\n",pcVar6);
    if ((screen->flags & 0x40000000) != 0) {
      printf("Double-buffering enabled\n");
    }
    SDL_WM_SetCaption("SDL test overlay","testoverlay");
    if (*(long *)(argv0 + 8) == 0) {
      local_a8 = "sample.bmp";
    }
    else {
      local_a8 = *(char **)(argv0 + 8);
    }
    uVar5 = SDL_RWFromFile(local_a8,"rb");
    pic = (SDL_Surface *)SDL_LoadBMP_RW(uVar5,1);
    pFVar2 = _stderr;
    if (pic == (SDL_Surface *)0x0) {
      uVar5 = SDL_GetError();
      fprintf(pFVar2,"Couldn\'t load %s: %s\n",local_a8,uVar5);
      quit(1);
    }
    local_80 = 0;
    format.palette._0_1_ = 0x20;
    format.palette._1_1_ = 4;
    format.palette._6_1_ = 0;
    format.palette._7_1_ = 8;
    format.BitsPerPixel = '\x10';
    format.BytesPerPixel = '\0';
    format.Bloss = 0xff;
    format.Aloss = '\0';
    format.Rshift = '\0';
    format.Gshift = '\0';
    format.Bshift = '\0';
    format.Ashift = 0xff;
    format._18_2_ = 0;
    format.Rmask = 0xff0000;
    format.Gmask = 0;
    format.palette._2_1_ = 0;
    format.palette._3_1_ = 0;
    format.palette._4_1_ = 0;
    format.palette._5_1_ = 8;
    format.Bmask = 0;
    format.Amask._0_1_ = 0;
    format._40_8_ = SDL_ConvertSurface(pic,&local_80,0);
    pFVar2 = _stderr;
    if (format._40_8_ == 0) {
      uVar5 = SDL_GetError();
      fprintf(pFVar2,"Couldn\'t convert picture to 32bits RGB: %s\n",uVar5);
      quit(1);
    }
    SDL_FreeSurface(pic);
    pic = (SDL_Surface *)format._40_8_;
    overlay = (SDL_Overlay *)
              SDL_CreateYUVOverlay
                        (*(undefined4 *)(format._40_8_ + 0x10),*(undefined4 *)(format._40_8_ + 0x14)
                         ,bmpfile._0_4_,screen);
    pFVar2 = _stderr;
    if (overlay == (SDL_Overlay *)0x0) {
      uVar5 = SDL_GetError();
      fprintf(pFVar2,"Couldn\'t create overlay: %s\n",uVar5);
      quit(1);
    }
    pcVar6 = "software";
    if ((*(uint *)&overlay->field_0x30 & 1) != 0) {
      pcVar6 = "hardware";
    }
    if (overlay->format == 0x32315659) {
      local_e8 = "YV12";
    }
    else {
      if (overlay->format == 0x56555949) {
        local_f0 = "IYUV";
      }
      else {
        if (overlay->format == 0x32595559) {
          local_f8 = "YUY2";
        }
        else {
          if (overlay->format == 0x59565955) {
            local_100 = "UYVY";
          }
          else {
            local_100 = "Unknown";
            if (overlay->format == 0x55595659) {
              local_100 = "YVYU";
            }
          }
          local_f8 = local_100;
        }
        local_f0 = local_f8;
      }
      local_e8 = local_f0;
    }
    printf("Created %dx%dx%d %s %s overlay\n",(ulong)(uint)overlay->w,(ulong)(uint)overlay->h,
           (ulong)(uint)overlay->planes,pcVar6,local_e8);
    for (newsurf._4_4_ = 0; (int)newsurf._4_4_ < overlay->planes; newsurf._4_4_ = newsurf._4_4_ + 1)
    {
      printf("  plane %d: pitch=%d\n",(ulong)newsurf._4_4_,
             (ulong)overlay->pitches[(int)newsurf._4_4_]);
    }
    iVar3 = SDL_GetTicks();
    UVar1 = overlay->format;
    if (UVar1 == 0x32315659) {
      ConvertRGBtoYV12(pic,overlay,monochrome,luminance);
    }
    else if (UVar1 == 0x32595559) {
      ConvertRGBtoYUY2(pic,overlay,monochrome,luminance);
    }
    else if (UVar1 == 0x55595659) {
      ConvertRGBtoYVYU(pic,overlay,monochrome,luminance);
    }
    else if (UVar1 == 0x56555949) {
      ConvertRGBtoIYUV(pic,overlay,monochrome,luminance);
    }
    else if (UVar1 == 0x59565955) {
      ConvertRGBtoUYVY(pic,overlay,monochrome,luminance);
    }
    else {
      printf("cannot convert RGB picture to obtained YUV format!\n");
      quit(1);
    }
    iVar4 = SDL_GetTicks();
    printf("Conversion Time: %d milliseconds\n",(ulong)(uint)(iVar4 - iVar3));
    iVar3 = SDL_GetTicks();
    Draw();
    iVar4 = SDL_GetTicks();
    printf("Time: %d milliseconds\n",(ulong)(uint)(iVar4 - iVar3));
    SDL_Delay(video_flags * 1000);
    SDL_Quit();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	char *argv0 = argv[0];
	int delay;
	int desired_bpp;
	Uint32 video_flags, overlay_format;
	const char *bmpfile;
#ifdef BENCHMARK_SDL
	Uint32 then, now;
#endif
	int i;

	/* Set default options and check command-line */
	scale=0;
        monochrome=0;
        luminance=100;
	delay = 1;
	w = WINDOW_WIDTH;
	h = WINDOW_HEIGHT;
	desired_bpp = 0;
	video_flags = 0;
	overlay_format = SDL_YV12_OVERLAY;

	while ( argc > 1 ) {
		if ( strcmp(argv[1], "-delay") == 0 ) {
			if ( argv[2] ) {
				delay = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -delay option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-width") == 0 ) {
			if ( argv[2] && ((w = atoi(argv[2])) > 0) ) {
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -width option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-height") == 0 ) {
			if ( argv[2] && ((h = atoi(argv[2])) > 0) ) {
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -height option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-bpp") == 0 ) {
			if ( argv[2] ) {
				desired_bpp = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -bpp option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-lum") == 0 ) {
			if ( argv[2] ) {
				luminance = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -lum option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-format") == 0 ) {
			if ( argv[2] ) {
				if(!strcmp(argv[2],"YV12"))
					overlay_format = SDL_YV12_OVERLAY;
				else if(!strcmp(argv[2],"IYUV"))
					overlay_format = SDL_IYUV_OVERLAY;
				else if(!strcmp(argv[2],"YUY2"))
					overlay_format = SDL_YUY2_OVERLAY;
				else if(!strcmp(argv[2],"UYVY"))
					overlay_format = SDL_UYVY_OVERLAY;
				else if(!strcmp(argv[2],"YVYU"))
					overlay_format = SDL_YVYU_OVERLAY;
				else
				{
					fprintf(stderr, "The -format option %s is not recognized\n",argv[2]);
					return(1);
				}
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -format option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-hw") == 0 ) {
			video_flags |= SDL_HWSURFACE;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-flip") == 0 ) {
			video_flags |= SDL_DOUBLEBUF;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-scale") == 0 ) {
			scale = 1;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-mono") == 0 ) {
			monochrome = 1;
			argv += 1;
			argc -= 1;
		} else
		if (( strcmp(argv[1], "-help") == 0 ) || (strcmp(argv[1], "-h") == 0)) {
                        PrintUsage(argv0);
                        return(1);
		} else
		if ( strcmp(argv[1], "-fullscreen") == 0 ) {
			video_flags |= SDL_FULLSCREEN;
			argv += 1;
			argc -= 1;
		} else
			break;
	}
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Initialize the display */
	screen = SDL_SetVideoMode(w, h, desired_bpp, video_flags);
	if ( screen == NULL ) {
		fprintf(stderr, "Couldn't set %dx%dx%d video mode: %s\n",
					w, h, desired_bpp, SDL_GetError());
		quit(1);
	}
	printf("Set%s %dx%dx%d mode\n",
			screen->flags & SDL_FULLSCREEN ? " fullscreen" : "",
			screen->w, screen->h, screen->format->BitsPerPixel);
	printf("(video surface located in %s memory)\n",
			(screen->flags&SDL_HWSURFACE) ? "video" : "system");
	if ( screen->flags & SDL_DOUBLEBUF ) {
		printf("Double-buffering enabled\n");
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption("SDL test overlay", "testoverlay");

	/* Load picture */
	bmpfile = argv[1] ? argv[1]:"sample.bmp";
	pic = SDL_LoadBMP(bmpfile);
	if ( pic == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s\n", bmpfile,
							SDL_GetError());
		quit(1);
	}

	/* Convert the picture to 32bits, for easy conversion */
	{
		SDL_Surface *newsurf;
		SDL_PixelFormat format;

		format.palette=NULL;
		format.BitsPerPixel=32;
		format.BytesPerPixel=4;
#if SDL_BYTEORDER == SDL_LIL_ENDIAN
		format.Rshift=0;
		format.Gshift=8;
		format.Bshift=16;
#else
		format.Rshift=24;
		format.Gshift=16;
		format.Bshift=8;
#endif
		format.Ashift=0;
		format.Rmask=0xff<<format.Rshift;
		format.Gmask=0xff<<format.Gshift;
		format.Bmask=0xff<<format.Bshift;
		format.Amask=0;
		format.Rloss=0;
		format.Gloss=0;
		format.Bloss=0;
		format.Aloss=8;
		format.colorkey=0;
		format.alpha=0;

		newsurf=SDL_ConvertSurface(pic, &format, SDL_SWSURFACE);
		if(!newsurf)
		{
			fprintf(stderr, "Couldn't convert picture to 32bits RGB: %s\n",
							SDL_GetError());
			quit(1);
		}
		SDL_FreeSurface(pic);
		pic=newsurf;
	}
	
	/* Create the overlay */
	overlay = SDL_CreateYUVOverlay(pic->w, pic->h, overlay_format, screen);
	if ( overlay == NULL ) {
		fprintf(stderr, "Couldn't create overlay: %s\n", SDL_GetError());
		quit(1);
	}
	printf("Created %dx%dx%d %s %s overlay\n",overlay->w,overlay->h,overlay->planes,
			overlay->hw_overlay?"hardware":"software",
			overlay->format==SDL_YV12_OVERLAY?"YV12":
			overlay->format==SDL_IYUV_OVERLAY?"IYUV":
			overlay->format==SDL_YUY2_OVERLAY?"YUY2":
			overlay->format==SDL_UYVY_OVERLAY?"UYVY":
			overlay->format==SDL_YVYU_OVERLAY?"YVYU":
			"Unknown");
	for(i=0; i<overlay->planes; i++)
	{
		printf("  plane %d: pitch=%d\n", i, overlay->pitches[i]);
	}
	
	/* Convert to YUV, and draw to the overlay */
#ifdef BENCHMARK_SDL
	then = SDL_GetTicks();
#endif
	switch(overlay->format)
	{
		case SDL_YV12_OVERLAY:
			ConvertRGBtoYV12(pic,overlay,monochrome,luminance);
			break;
		case SDL_UYVY_OVERLAY:
			ConvertRGBtoUYVY(pic,overlay,monochrome,luminance);
			break;
		case SDL_YVYU_OVERLAY:
			ConvertRGBtoYVYU(pic,overlay,monochrome,luminance);
			break;
		case SDL_YUY2_OVERLAY:
			ConvertRGBtoYUY2(pic,overlay,monochrome,luminance);
			break;
		case SDL_IYUV_OVERLAY:
			ConvertRGBtoIYUV(pic,overlay,monochrome,luminance);
			break;
		default:
			printf("cannot convert RGB picture to obtained YUV format!\n");
			quit(1);
			break;
	}
#ifdef BENCHMARK_SDL
	now = SDL_GetTicks();
	printf("Conversion Time: %d milliseconds\n", now-then);
#endif
	
	/* Do all the drawing work */
#ifdef BENCHMARK_SDL
	then = SDL_GetTicks();
#endif
	Draw();
#ifdef BENCHMARK_SDL
	now = SDL_GetTicks();
	printf("Time: %d milliseconds\n", now-then);
#endif
	SDL_Delay(delay*1000);
	SDL_Quit();
	return(0);
}